

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

FArchive * __thiscall FArchive::ReadObject(FArchive *this,DObject **obj,PClass *wanttype)

{
  DWORD DVar1;
  PClass *pPVar2;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 this_00;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar3;
  DObject *pDVar4;
  BYTE playerNum;
  BYTE objHead;
  
  (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,&objHead,1);
  switch(objHead) {
  case '\x02':
    goto switchD_00452d1f_caseD_2;
  case '\x03':
    DVar1 = ReadCount(this);
    if ((this->ArchiveToObject).Count <= DVar1) {
      I_Error("Object reference too high (%u; max is %u)\n",(ulong)DVar1);
    }
    *obj = (this->ArchiveToObject).Array[DVar1];
    break;
  case '\x04':
    *obj = (DObject *)0x0;
    break;
  case '\x05':
    (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,&playerNum,1);
    if (this->m_HubTravel == true) {
      pPVar2 = ReadStoredClass(this,wanttype);
      *obj = (DObject *)(&players)[(ulong)playerNum * 0x54];
      this_00.o = PClass::CreateNew(pPVar2);
      aVar3.o = (*obj).o;
      if ((AInventory *)(*obj).p == (AInventory *)0x0) {
        aVar3.o = this_00.o;
      }
      MapObject(this,aVar3.o);
      DObject::SerializeUserVars((DObject *)this_00,this);
      (**(code **)(*(long *)this_00 + 0x18))(this_00.p,this);
      DObject::CheckIfSerialized((DObject *)this_00);
      aVar3.o = this_00.o;
      if (*obj == (DObject *)0x0) {
LAB_00452f7a:
        *obj = (DObject *)this_00;
        ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&players + (ulong)playerNum * 0x54))->o =
             (DObject *)this_00;
        return this;
      }
      while (aVar3.p = &GC::ReadBarrier<AInventory>((AInventory **)&(aVar3.p)->Inventory)->
                        super_AActor, (AInventory *)aVar3.p != (AInventory *)0x0) {
        *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(aVar3.p + 1) = this_00;
      }
LAB_00452f6f:
      (*(((AActor *)&(this_00.p)->super_DThinker)->super_DThinker).super_DObject._vptr_DObject[4])
                (this_00.p);
      return this;
    }
  case '\x01':
    pPVar2 = ReadStoredClass(this,wanttype);
    pDVar4 = PClass::CreateNew(pPVar2);
    *obj = pDVar4;
    MapObject(this,pDVar4);
    DObject::SerializeUserVars(*obj,this);
    (*(*obj)->_vptr_DObject[3])(*obj,this);
    pDVar4 = *obj;
LAB_00452f5a:
    DObject::CheckIfSerialized(pDVar4);
    break;
  case '\x06':
    (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,&playerNum,1);
    if (this->m_HubTravel == true) {
      pPVar2 = ReadClass(this,wanttype);
      *obj = (DObject *)(&players)[(ulong)playerNum * 0x54];
      this_00.o = PClass::CreateNew(pPVar2);
      aVar3.o = (*obj).o;
      if ((AInventory *)(*obj).p == (AInventory *)0x0) {
        aVar3.o = this_00.o;
      }
      MapObject(this,aVar3.o);
      DObject::SerializeUserVars(this_00.o,this);
      (*(((AActor *)&(this_00.p)->super_DThinker)->super_DThinker).super_DObject._vptr_DObject[3])
                (this_00.p,this);
      DObject::CheckIfSerialized(this_00.o);
      aVar3.o = this_00.o;
      if (*obj == (DObject *)0x0) goto LAB_00452f7a;
      while (aVar3.p = &GC::ReadBarrier<AInventory>((AInventory **)&(aVar3.p)->Inventory)->
                        super_AActor, aVar3.p != (AActor *)0x0) {
        ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(aVar3.p + 1))->o = (DObject *)this_00;
      }
      goto LAB_00452f6f;
    }
    goto switchD_00452d1f_caseD_2;
  default:
    if (objHead == ',') {
      *obj = (DObject *)0xffffffffffffffff;
    }
    else {
      I_Error("Unknown object code (%d) in archive\n");
    }
  }
  return this;
switchD_00452d1f_caseD_2:
  pPVar2 = ReadClass(this,wanttype);
  pDVar4 = PClass::CreateNew(pPVar2);
  *obj = pDVar4;
  MapObject(this,pDVar4);
  DObject::SerializeUserVars(pDVar4,this);
  (*pDVar4->_vptr_DObject[3])(pDVar4,this);
  goto LAB_00452f5a;
}

Assistant:

FArchive &FArchive::ReadObject (DObject* &obj, PClass *wanttype)
{
	BYTE objHead;
	const PClass *type;
	BYTE playerNum;
	DWORD index;
	DObject *newobj;

	operator<< (objHead);

	switch (objHead)
	{
	case NULL_OBJ:
		obj = NULL;
		break;

	case M1_OBJ:
		obj = (DObject *)~0;
		break;

	case OLD_OBJ:
		index = ReadCount();
		if (index >= ArchiveToObject.Size())
		{
			I_Error ("Object reference too high (%u; max is %u)\n", index, ArchiveToObject.Size());
		}
		obj = ArchiveToObject[index];
		break;

	case NEW_PLYR_CLS_OBJ:
		operator<< (playerNum);
		if (m_HubTravel)
		{
			// If travelling inside a hub, use the existing player actor
			type = ReadClass (wanttype);
//			Printf ("New player class: %s (%u)\n", type->Name, m_File->Tell());
			obj = players[playerNum].mo;

			// But also create a new one so that we can get past the one
			// stored in the archive.
			AActor *tempobj = static_cast<AActor *>(type->CreateNew ());
			MapObject (obj != NULL ? obj : tempobj);
			tempobj->SerializeUserVars (*this);
			tempobj->Serialize (*this);
			tempobj->CheckIfSerialized ();
			// If this player is not present anymore, keep the new body
			// around just so that the load will succeed.
			if (obj != NULL)
			{
				// When the temporary player's inventory items were loaded,
				// they became owned by the real player. Undo that now.
				for (AInventory *item = tempobj->Inventory; item != NULL; item = item->Inventory)
				{
					item->Owner = tempobj;
				}
				tempobj->Destroy ();
			}
			else
			{
				obj = tempobj;
				players[playerNum].mo = static_cast<APlayerPawn *>(obj);
			}
			break;
		}
		/* fallthrough when not travelling to a previous level */
	case NEW_CLS_OBJ:
		type = ReadClass (wanttype);
//		Printf ("New class: %s (%u)\n", type->Name, m_File->Tell());
		newobj = obj = type->CreateNew ();
		MapObject (obj);
		newobj->SerializeUserVars (*this);
		newobj->Serialize (*this);
		newobj->CheckIfSerialized ();
		break;

	case NEW_PLYR_OBJ:
		operator<< (playerNum);
		if (m_HubTravel)
		{
			type = ReadStoredClass (wanttype);
//			Printf ("Use player class: %s (%u)\n", type->Name, m_File->Tell());
			obj = players[playerNum].mo;

			AActor *tempobj = static_cast<AActor *>(type->CreateNew ());
			MapObject (obj != NULL ? obj : tempobj);
			tempobj->SerializeUserVars (*this);
			tempobj->Serialize (*this);
			tempobj->CheckIfSerialized ();
			if (obj != NULL)
			{
				for (AInventory *item = tempobj->Inventory;
					item != NULL; item = item->Inventory)
				{
					item->Owner = tempobj;
				}
				tempobj->Destroy ();
			}
			else
			{
				obj = tempobj;
				players[playerNum].mo = static_cast<APlayerPawn *>(obj);
			}
			break;
		}
		/* fallthrough when not travelling to a previous level */
	case NEW_OBJ:
		type = ReadStoredClass (wanttype);
//		Printf ("Use class: %s (%u)\n", type->Name, m_File->Tell());
		obj = type->CreateNew ();
		MapObject (obj);
		obj->SerializeUserVars (*this);
		obj->Serialize (*this);
		obj->CheckIfSerialized ();
		break;

	default:
		I_Error ("Unknown object code (%d) in archive\n", objHead);
	}
	return *this;
}